

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idefs.h
# Opt level: O0

Am_Input_Char * __thiscall Am_Input_Char::operator=(Am_Input_Char *this,Am_Input_Char *value)

{
  Am_Input_Char *value_local;
  Am_Input_Char *this_local;
  
  *(undefined2 *)this = *(undefined2 *)value;
  *(ushort *)(this + 2) = *(ushort *)(this + 2) & 0xfffe | *(ushort *)(value + 2) & 1;
  *(ushort *)(this + 2) = *(ushort *)(this + 2) & 0xfffd | *(ushort *)(value + 2) & 2;
  *(ushort *)(this + 2) = *(ushort *)(this + 2) & 0xfffb | *(ushort *)(value + 2) & 4;
  *(ushort *)(this + 2) = *(ushort *)(this + 2) & 0xfff7 | (ushort)((byte)value[2] >> 3 & 1) << 3;
  *(ushort *)(this + 2) = *(ushort *)(this + 2) & 0xff0f | (*(ushort *)(value + 2) >> 4 & 0xf) << 4;
  *(ushort *)(this + 2) = *(ushort *)(this + 2) & 0xf0ff | (*(ushort *)(value + 2) >> 8 & 0xf) << 8;
  return this;
}

Assistant:

Am_Input_Char &operator=(const Am_Input_Char &value)
  {
    code = value.code;
    shift = value.shift;
    control = value.control;
    meta = value.meta;
    any_modifier = value.any_modifier;
    button_down = value.button_down;
    click_count = value.click_count;
    return *this;
  }